

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawSplineLinear(Vector2 *points,int pointCount,float thick,Color color)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Vector2 strip [4];
  Vector2 local_78;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (1 < pointCount) {
    uVar2 = 0;
    fVar5 = 0.0;
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    do {
      local_58 = points[uVar2 + 1].x - points[uVar2].x;
      fVar4 = points[uVar2 + 1].y - points[uVar2].y;
      fVar3 = local_58 * local_58 + fVar4 * fVar4;
      if (fVar3 < 0.0) {
        local_48 = fVar5;
        uStack_44 = uVar6;
        uStack_40 = uVar7;
        uStack_3c = uVar8;
        fVar3 = sqrtf(fVar3);
        fVar5 = local_48;
        uStack_54 = uStack_44;
        uStack_50 = uStack_40;
        uStack_4c = uStack_3c;
      }
      else {
        fVar3 = SQRT(fVar3);
        uStack_54 = uVar6;
        uStack_50 = uVar7;
        uStack_4c = uVar8;
      }
      uVar1 = uVar2 + 1;
      fVar5 = (float)(~-(uint)(0.0 < fVar3) & (uint)fVar5 |
                     (uint)(thick / (fVar3 + fVar3)) & -(uint)(0.0 < fVar3));
      fVar4 = fVar4 * -fVar5;
      local_58 = local_58 * fVar5;
      local_78.x = points[uVar2].x - fVar4;
      local_78.y = points[uVar2].y - local_58;
      local_70 = points[uVar2].x + fVar4;
      local_6c = points[uVar2].y + local_58;
      local_68 = points[uVar2 + 1].x - fVar4;
      local_64 = points[uVar2 + 1].y - local_58;
      local_60 = fVar4 + points[uVar2 + 1].x;
      local_5c = local_58 + points[uVar2 + 1].y;
      local_58 = fVar5;
      DrawTriangleStrip(&local_78,4,color);
      uVar2 = uVar1;
      fVar5 = local_58;
      uVar6 = uStack_54;
      uVar7 = uStack_50;
      uVar8 = uStack_4c;
    } while (pointCount - 1 != uVar1);
  }
  return;
}

Assistant:

void DrawSplineLinear(const Vector2 *points, int pointCount, float thick, Color color)
{
    if (pointCount < 2) return;

#if defined(SUPPORT_SPLINE_MITERS)
    Vector2 prevNormal = (Vector2){-(points[1].y - points[0].y), (points[1].x - points[0].x)};
    float prevLength = sqrtf(prevNormal.x*prevNormal.x + prevNormal.y*prevNormal.y);

    if (prevLength > 0.0f)
    {
        prevNormal.x /= prevLength;
        prevNormal.y /= prevLength;
    }
    else
    {
        prevNormal.x = 0.0f;
        prevNormal.y = 0.0f;
    }

    Vector2 prevRadius = { 0.5f*thick*prevNormal.x, 0.5f*thick*prevNormal.y };

    for (int i = 0; i < pointCount - 1; i++)
    {
        Vector2 normal = { 0 };

        if (i < pointCount - 2)
        {
            normal = (Vector2){-(points[i + 2].y - points[i + 1].y), (points[i + 2].x - points[i + 1].x)};
            float normalLength = sqrtf(normal.x*normal.x + normal.y*normal.y);

            if (normalLength > 0.0f)
            {
                normal.x /= normalLength;
                normal.y /= normalLength;
            }
            else
            {
                normal.x = 0.0f;
                normal.y = 0.0f;
            }
        }
        else
        {
            normal = prevNormal;
        }

        Vector2 radius = { prevNormal.x + normal.x, prevNormal.y + normal.y };
        float radiusLength = sqrtf(radius.x*radius.x + radius.y*radius.y);

        if (radiusLength > 0.0f)
        {
            radius.x /= radiusLength;
            radius.y /= radiusLength;
        }
        else
        {
            radius.x = 0.0f;
            radius.y = 0.0f;
        }

        float cosTheta = radius.x*normal.x + radius.y*normal.y;

        if (cosTheta != 0.0f)
        {
            radius.x *= (thick*0.5f/cosTheta);
            radius.y *= (thick*0.5f/cosTheta);
        }
        else
        {
            radius.x = 0.0f;
            radius.y = 0.0f;
        }

        Vector2 strip[4] = {
            { points[i].x - prevRadius.x, points[i].y - prevRadius.y },
            { points[i].x + prevRadius.x, points[i].y + prevRadius.y },
            { points[i + 1].x - radius.x, points[i + 1].y - radius.y },
            { points[i + 1].x + radius.x, points[i + 1].y + radius.y }
        };

        DrawTriangleStrip(strip, 4, color);

        prevRadius = radius;
        prevNormal = normal;
    }

#else   // !SUPPORT_SPLINE_MITERS

    Vector2 delta = { 0 };
    float length = 0.0f;
    float scale = 0.0f;

    for (int i = 0; i < pointCount - 1; i++)
    {
        delta = (Vector2){ points[i + 1].x - points[i].x, points[i + 1].y - points[i].y };
        length = sqrtf(delta.x*delta.x + delta.y*delta.y);

        if (length > 0) scale = thick/(2*length);

        Vector2 radius = { -scale*delta.y, scale*delta.x };
        Vector2 strip[4] = {
            { points[i].x - radius.x, points[i].y - radius.y },
            { points[i].x + radius.x, points[i].y + radius.y },
            { points[i + 1].x - radius.x, points[i + 1].y - radius.y },
            { points[i + 1].x + radius.x, points[i + 1].y + radius.y }
        };

        DrawTriangleStrip(strip, 4, color);
    }
#endif

#if defined(SUPPORT_SPLINE_SEGMENT_CAPS)
    // TODO: Add spline segment rounded caps at the begin/end of the spline
#endif
}